

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayFill(PrintExpressionContents *this,ArrayFill *curr)

{
  bool bVar1;
  HeapType type;
  TypeNamePrinter local_70;
  ArrayFill *local_18;
  ArrayFill *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (ArrayFill *)this;
  bVar1 = printUnreachableOrNullReplacement(this,curr->ref);
  if (!bVar1) {
    printMedium(this->o,"array.fill ");
    anon_unknown_217::TypeNamePrinter::TypeNamePrinter(&local_70,this->o,this->wasm);
    type = wasm::Type::getHeapType(&local_18->ref->type);
    anon_unknown_217::TypeNamePrinter::print(&local_70,type);
    anon_unknown_217::TypeNamePrinter::~TypeNamePrinter(&local_70);
  }
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    if (printUnreachableOrNullReplacement(curr->ref)) {
      return;
    }
    printMedium(o, "array.fill ");
    TypeNamePrinter(o, wasm).print(curr->ref->type.getHeapType());
  }